

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O1

void __thiscall
QDateTimeEditPrivate::updateCache(QDateTimeEditPrivate *this,QVariant *val,QString *str)

{
  long lVar1;
  long lVar2;
  char cVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  State unusedState;
  int unused;
  undefined1 auStack_48 [24];
  char16_t *pcStack_30;
  qsizetype local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = ::QVariant::equals(val);
  if (cVar3 != '\0') {
    lVar1 = (str->d).size;
    lVar2 = (this->super_QAbstractSpinBoxPrivate).cachedText.d.size;
    if (lVar1 == lVar2) {
      QVar4.m_data = (str->d).ptr;
      QVar4.m_size = lVar1;
      QVar5.m_data = (this->super_QAbstractSpinBoxPrivate).cachedText.d.ptr;
      QVar5.m_size = lVar2;
      cVar3 = QtPrivate::equalStrings(QVar4,QVar5);
      if ((cVar3 != '\0') && (this->cacheGuard != true)) goto LAB_003eb8b2;
    }
  }
  this->cacheGuard = true;
  auStack_48._16_8_ = (str->d).d;
  pcStack_30 = (str->d).ptr;
  local_28 = (str->d).size;
  if ((QArrayData *)auStack_48._16_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QArrayData *)&((QArrayData *)auStack_48._16_8_)->ref_)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((QArrayData *)auStack_48._16_8_)->ref_)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  auStack_48._12_4_ = QLineEdit::cursorPosition((this->super_QAbstractSpinBoxPrivate).edit);
  auStack_48._8_4_ = 0xaaaaaaaa;
  validateAndInterpret
            ((QDateTimeEditPrivate *)auStack_48,(QString *)this,(int *)(auStack_48 + 0x10),
             (State *)(auStack_48 + 0xc),(bool)((char)auStack_48 + '\b'));
  QDateTime::~QDateTime((QDateTime *)auStack_48);
  this->cacheGuard = false;
  if ((QArrayData *)auStack_48._16_8_ != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)auStack_48._16_8_)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)auStack_48._16_8_)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)auStack_48._16_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)auStack_48._16_8_,2,0x10);
    }
  }
LAB_003eb8b2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::updateCache(const QVariant &val, const QString &str) const
{
    if (val != cachedValue || str != cachedText || cacheGuard) {
        cacheGuard = true;
        QString copy = str;
        int unused = edit->cursorPosition();
        QValidator::State unusedState;
        validateAndInterpret(copy, unused, unusedState);
        cacheGuard = false;
    }
}